

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Instruction * __thiscall
spv::Builder::addEntryPoint(Builder *this,ExecutionModel model,Function *function,char *name)

{
  Id id;
  Instruction *pIVar1;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48 [3];
  Instruction *local_30;
  Instruction *entryPoint;
  char *name_local;
  Function *function_local;
  Builder *pBStack_10;
  ExecutionModel model_local;
  Builder *this_local;
  
  entryPoint = (Instruction *)name;
  name_local = (char *)function;
  function_local._4_4_ = model;
  pBStack_10 = this;
  pIVar1 = (Instruction *)
           Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,model));
  Instruction::Instruction(pIVar1,OpEntryPoint);
  local_30 = pIVar1;
  Instruction::addImmediateOperand(pIVar1,function_local._4_4_);
  pIVar1 = local_30;
  id = Function::getId((Function *)name_local);
  Instruction::addIdOperand(pIVar1,id);
  Instruction::addStringOperand(local_30,(char *)entryPoint);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_48,local_30
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->entryPoints,(value_type *)local_48);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_48);
  return local_30;
}

Assistant:

Instruction* Builder::addEntryPoint(ExecutionModel model, Function* function, const char* name)
{
    Instruction* entryPoint = new Instruction(OpEntryPoint);
    entryPoint->addImmediateOperand(model);
    entryPoint->addIdOperand(function->getId());
    entryPoint->addStringOperand(name);

    entryPoints.push_back(std::unique_ptr<Instruction>(entryPoint));

    return entryPoint;
}